

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpTools.cpp
# Opt level: O0

void __thiscall UdpTools::~UdpTools(UdpTools *this)

{
  UdpTools *this_local;
  
  ~UdpTools(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

UdpTools::~UdpTools() {
	// TODO  Auto-generated destructor stub
}